

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Path::make(Path *this,Value *root)

{
  bool bVar1;
  reference key;
  PathArgument *arg;
  __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
  local_28;
  const_iterator it;
  Value *node;
  Value *root_local;
  Path *this_local;
  
  it._M_current = (PathArgument *)root;
  local_28._M_current =
       (PathArgument *)
       std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::begin(&this->args_);
  while( true ) {
    arg = (PathArgument *)
          std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::end(&this->args_);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
                        *)&arg);
    if (!bVar1) break;
    key = __gnu_cxx::
          __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
          ::operator*(&local_28);
    if (key->kind_ == kindIndex) {
      Value::isArray((Value *)it._M_current);
      it._M_current = (PathArgument *)Value::operator[](it._M_current,key->index_);
    }
    else if (key->kind_ == kindKey) {
      Value::isObject((Value *)it._M_current);
      it._M_current = (PathArgument *)Value::operator[](it._M_current,&key->key_);
    }
    __gnu_cxx::
    __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
    ::operator++(&local_28);
  }
  return (Value *)it._M_current;
}

Assistant:

Value& Path::make(Value& root) const {
  Value* node = &root;
  for (Args::const_iterator it = args_.begin(); it != args_.end(); ++it) {
    const PathArgument& arg = *it;
    if (arg.kind_ == PathArgument::kindIndex) {
      if (!node->isArray()) {
        // Error: node is not an array at position ...
      }
      node = &((*node)[arg.index_]);
    } else if (arg.kind_ == PathArgument::kindKey) {
      if (!node->isObject()) {
        // Error: node is not an object at position...
      }
      node = &((*node)[arg.key_]);
    }
  }
  return *node;
}